

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar1.cpp
# Opt level: O0

void detectAndDisplay(Mat *frame)

{
  pointer *ppRVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Point PVar5;
  Point PVar6;
  reference pvVar7;
  ostream *poVar8;
  size_type sVar9;
  int in_R8D;
  _InputArray local_310;
  Scalar_<double> local_2f8;
  Rect_<int> local_2d8;
  _InputOutputArray local_2c8;
  Point_<int> local_2b0;
  Point center_2;
  size_t i_2;
  Size_<int> local_298;
  _InputArray local_290;
  Scalar_<double> local_278;
  Rect_<int> local_258;
  _InputOutputArray local_248;
  Point_<int> local_230;
  Point center_1;
  size_t i_1;
  Size_<int> local_218;
  _InputArray local_210;
  Scalar_<double> local_1f8;
  Rect_<int> local_1d8;
  _InputOutputArray local_1c8;
  Point_<int> local_1b0;
  Point center;
  size_t i;
  Size_<int> local_198;
  _InputArray local_190;
  _InputArray local_178;
  _InputArray local_150;
  Mat local_138 [8];
  Mat mask;
  Mat local_d8 [8];
  Mat frame_gray;
  undefined1 local_78 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> left;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> face;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> fist;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> hand;
  int s1;
  Mat *frame_local;
  
  hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
             &fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
             &face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
             &left.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_78);
  cv::Mat::Mat(local_d8);
  cv::Mat::Mat(local_138);
  cv::_InputArray::_InputArray(&local_150,frame);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_178,local_138);
  cv::cvtColor((cv *)&local_150,&local_178,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_178);
  cv::_InputArray::~_InputArray(&local_150);
  cv::_InputArray::_InputArray(&local_190,frame);
  cv::Size_<int>::Size_(&local_198,0x1e,0x1e);
  cv::Size_<int>::Size_((Size_<int> *)&i);
  cv::CascadeClassifier::detectMultiScale
            (0x3ff199999999999a,hand_classifier,&local_190,
             &fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,2,2,&local_198,&i);
  cv::_InputArray::~_InputArray(&local_190);
  center.x = 0;
  center.y = 0;
  do {
    PVar5 = center;
    PVar6 = (Point)std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                             ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                              &fist.
                               super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((ulong)PVar6 <= (ulong)PVar5) {
      sVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                        ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                         &fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar9 == 0) {
        hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      }
      cv::_InputArray::_InputArray(&local_210,frame);
      cv::Size_<int>::Size_(&local_218,0x1e,0x1e);
      cv::Size_<int>::Size_((Size_<int> *)&i_1);
      cv::CascadeClassifier::detectMultiScale
                (0x3ff199999999999a,fist_classifier,&local_210,
                 &face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,2,2,&local_218,&i_1);
      cv::_InputArray::~_InputArray(&local_210);
      center_1.x = 0;
      center_1.y = 0;
      while( true ) {
        PVar5 = center_1;
        PVar6 = (Point)std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                                 ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                                  &face.
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((ulong)PVar6 <= (ulong)PVar5) break;
        pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                           ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                            &face.
                             super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_1);
        if (0x7d < pvVar7->height) {
          pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                             ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                              &face.
                               super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_1
                             );
          if (0x7d < pvVar7->width) {
            ppRVar1 = &face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                               ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)ppRVar1,
                                (size_type)center_1);
            iVar2 = pvVar7->x;
            pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                               ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)ppRVar1,
                                (size_type)center_1);
            iVar3 = pvVar7->width;
            pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                               ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)ppRVar1,
                                (size_type)center_1);
            iVar4 = pvVar7->y;
            pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                               ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)ppRVar1,
                                (size_type)center_1);
            cv::Point_<int>::Point_
                      (&local_230,(int)((double)iVar2 * 1.5 + (double)iVar3 * 0.5),
                       (int)((double)iVar4 * 1.5 + (double)pvVar7->height * 0.5));
            cv::_InputOutputArray::_InputOutputArray(&local_248,frame);
            pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                               ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                                &face.
                                 super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (size_type)center_1);
            cv::Rect_<int>::Rect_(&local_258,pvVar7);
            cv::Scalar_<double>::Scalar_(&local_278,255.0,255.0,255.0,0.0);
            cv::rectangle(&local_248,&local_258,&local_278,5,8,0);
            cv::_InputOutputArray::~_InputOutputArray(&local_248);
            poVar8 = std::operator<<((ostream *)outfile,"fist");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          }
        }
        center_1 = (Point)((long)center_1 + 1);
      }
      sVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                        ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                         &face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar9 == 0) {
        hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      }
      cv::_InputArray::_InputArray(&local_290,local_138);
      cv::Size_<int>::Size_(&local_298,0x1e,0x1e);
      cv::Size_<int>::Size_((Size_<int> *)&i_2);
      cv::CascadeClassifier::detectMultiScale
                (0x3ff199999999999a,face_classifier,&local_290,
                 &left.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,2,2,&local_298,&i_2);
      cv::_InputArray::~_InputArray(&local_290);
      center_2.x = 0;
      center_2.y = 0;
      while( true ) {
        PVar5 = center_2;
        PVar6 = (Point)std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                                 ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                                  &left.
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((ulong)PVar6 <= (ulong)PVar5) break;
        pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                           ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                            &left.
                             super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_2);
        if (0x96 < pvVar7->height) {
          pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                             ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                              &left.
                               super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_2
                             );
          if (0x96 < pvVar7->width) {
            ppRVar1 = &left.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                               ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)ppRVar1,
                                (size_type)center_2);
            iVar2 = pvVar7->x;
            pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                               ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)ppRVar1,
                                (size_type)center_2);
            iVar3 = pvVar7->width;
            pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                               ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)ppRVar1,
                                (size_type)center_2);
            iVar4 = pvVar7->y;
            pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                               ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)ppRVar1,
                                (size_type)center_2);
            cv::Point_<int>::Point_
                      (&local_2b0,(int)((double)iVar2 * 2.5 + (double)iVar3 * 2.5),
                       (int)((double)iVar4 * 2.5 + (double)pvVar7->height * 2.5));
            cv::_InputOutputArray::_InputOutputArray(&local_2c8,frame);
            pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                               ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                                &left.
                                 super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (size_type)center_2);
            cv::Rect_<int>::Rect_(&local_2d8,pvVar7);
            cv::Scalar_<double>::Scalar_(&local_2f8,255.0,255.0,0.0,0.0);
            cv::rectangle(&local_2c8,&local_2d8,&local_2f8,5,8,0);
            cv::_InputOutputArray::~_InputOutputArray(&local_2c8);
            poVar8 = std::operator<<((ostream *)outfile,"face");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          }
        }
        center_2 = (Point)((long)center_2 + 1);
      }
      sVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                        ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                         &left.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar9 == 0) {
        hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      }
      if (hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 3) {
        poVar8 = std::operator<<((ostream *)outfile,"none");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      cv::_InputArray::_InputArray(&local_310,frame);
      cv::imshow((string *)&window_name_abi_cxx11_,&local_310);
      cv::_InputArray::~_InputArray(&local_310);
      cv::Mat::~Mat(local_138);
      cv::Mat::~Mat(local_d8);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_78);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                 &left.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                 &face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                 &fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                       ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                        &fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center);
    if (pvVar7->width < 0xb0) {
LAB_00104e56:
      hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           hand.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
    else {
      pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                          &fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center);
      if (pvVar7->height < 0xb0) goto LAB_00104e56;
      ppRVar1 = &fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)ppRVar1,
                          (size_type)center);
      iVar2 = pvVar7->x;
      pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)ppRVar1,
                          (size_type)center);
      iVar3 = pvVar7->width;
      pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)ppRVar1,
                          (size_type)center);
      iVar4 = pvVar7->y;
      pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)ppRVar1,
                          (size_type)center);
      cv::Point_<int>::Point_
                (&local_1b0,(int)((double)iVar2 * 1.5 + (double)iVar3 * 0.5),
                 (int)((double)iVar4 * 1.5 + (double)pvVar7->height * 0.5));
      cv::_InputOutputArray::_InputOutputArray(&local_1c8,frame);
      pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                          &fist.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center);
      cv::Rect_<int>::Rect_(&local_1d8,pvVar7);
      cv::Scalar_<double>::Scalar_(&local_1f8,255.0,255.0,255.0,0.0);
      cv::rectangle(&local_1c8,&local_1d8,&local_1f8,5,8,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_1c8);
      poVar8 = std::operator<<((ostream *)outfile,"palm");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    center = (Point)((long)center + 1);
  } while( true );
}

Assistant:

void detectAndDisplay( Mat frame )
{
  int s1 = 0;
  std::vector<Rect> hand;
  std::vector<Rect> fist;
  std::vector<Rect> face;
  std::vector<Rect> left;
  Mat frame_gray,mask;
  //mask = frame;

  //blur(frame,frame,Size(3,3)); 
  cvtColor( frame, mask ,COLOR_BGR2GRAY );
  //equalizeHist( frame, frame_gray );
  //threshold( frame, frame_gray, threshold_value, max_binary_value, threshold_type );
  //threshold(frame,frame_gray,150,180,THRESH_BINARY);
  //adaptiveThreshold(frame, frame_gray, 255 , ADAPTIVE_THRESH_GAUSSIAN_C, THRESH_BINARY ,11,2);
  //imshow( "Window-2", frame_gray );
  hand_classifier.detectMultiScale( frame, hand, 1.1, 2, 0|CASCADE_SCALE_IMAGE, Size(30, 30));

for( size_t i = 0; i < hand.size(); i++ )
{
//Point center(hand[i].x *1.5+ hand[i].width*0.5, hand[i].y*1.5 + hand[i].height*0.5);
//cv::rectangle(frame, hand[i], cv::Scalar(255, 255, 255), 5);
//imshow(window_name,hand[i]);
//cout<<hand[i]<<"\n";
if (hand[i].width>175 && hand[i].height>175)// cout<<"palm"<<"width:  "<<hand[i].width<<"  height: "<<hand[i].height<<"\n";
{
//cout<<"palm"<<"\n";
Point center(hand[i].x *1.5+ hand[i].width*0.5, hand[i].y*1.5 + hand[i].height*0.5);
cv::rectangle(frame, hand[i], cv::Scalar(255, 255, 255), 5);
outfile << "palm" << endl;
}
else s1++;
}

if (hand.size()==0) s1++;

//fist_classifier.detectMultiScale( frame_gray, fist, 1.1, 2, 0|CV_HAAR_SCALE_IMAGE, Size(30, 30) );
fist_classifier.detectMultiScale( frame, fist, 1.1, 2, 0|CASCADE_SCALE_IMAGE, Size(30, 30) );

for ( size_t i = 0; i < fist.size(); i++ )
{
//Point center(fist[i].x *1.5+ fist[i].width*0.5, fist[i].y*1.5 + fist[i].height*0.5);
//cv::rectangle(frame, fist[i], cv::Scalar(255, 255, 255), 5);
//imshow(window_name,fist[i]);
if (fist[i].height>125 && fist[i].width > 125) //cout<<"fist-->height  "<<fist[i].height<<"  fist-->width  "<<fist[i].width <<"\n";
{
//cout<<"fist"<<"\n";
Point center(fist[i].x *1.5+ fist[i].width*0.5, fist[i].y*1.5 + fist[i].height*0.5);
cv::rectangle(frame, fist[i], cv::Scalar(255, 255, 255), 5);
outfile << "fist" << endl;
}
//else s1++;
}

if (fist.size()==0) s1++;

// smile classifier

//smile_classifier.detectMultiScale(frame,smile, 1.7, 22);
face_classifier.detectMultiScale( mask, face, 1.1, 2, 0|CASCADE_SCALE_IMAGE, Size(30, 30));

for (size_t i = 0;i< face.size();i++)
{
//Point center(face[i].x *2.5+ face[i].width*2.5, face[i].y*2.5 + face[i].height*2.5);
if (face[i].height>150 && face[i].width>150)
{
Point center(face[i].x *2.5+ face[i].width*2.5, face[i].y*2.5 + face[i].height*2.5);  
cv::rectangle(frame, face[i], cv::Scalar(255, 255, 0), 5);
//cout<<"smile-->height  "<<face[i].height<<"smile-->width "<<face[i].width <<"\n";
//cout<<"***"<<"face"<<"\n";
outfile << "face" << endl;
}
//else s1++;
//imshow("new-window", frame_gray);
}

if (face.size()==0) s1++;

if (s1 == 3) 
{
  outfile<< "none" << endl;
  //cout<<"none"<<"\n";
}
//cout<<s1<<endl;
imshow( window_name, frame);
}